

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O2

void __thiscall
chrono::utils::ChISO2631_Shock_SeatCushionLogger::AddData
          (ChISO2631_Shock_SeatCushionLogger *this,double ax,double ay,double az)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = ChSineStep(this->m_logging_time,this->m_tstart1,0.0,this->m_tstart2,1.0);
  dVar1 = this->m_logging_time;
  dVar3 = ChButterworth_Lowpass::Filter(&this->m_lpx,dVar2 * ax);
  ChFunction_Recorder::AddPoint(&this->m_raw_inp_x,dVar1,dVar3,1.0);
  dVar1 = this->m_logging_time;
  dVar3 = ChButterworth_Lowpass::Filter(&this->m_lpy,dVar2 * ay);
  ChFunction_Recorder::AddPoint(&this->m_raw_inp_y,dVar1,dVar3,1.0);
  dVar1 = this->m_logging_time;
  dVar2 = ChButterworth_Lowpass::Filter(&this->m_lpz,dVar2 * az);
  ChFunction_Recorder::AddPoint(&this->m_raw_inp_z,dVar1,dVar2,1.0);
  this->m_logging_time = this->m_step_inp + this->m_logging_time;
  return;
}

Assistant:

void ChISO2631_Shock_SeatCushionLogger::AddData(double ax, double ay, double az) {
    double startFactor = ChSineStep(m_logging_time, m_tstart1, 0.0, m_tstart2, 1.0);

    // speed of a vehicle changes very much during obstacle crossing, we take the first value as significant
    // instead of an average value
    m_raw_inp_x.AddPoint(m_logging_time, m_lpx.Filter(startFactor * ax));
    m_raw_inp_y.AddPoint(m_logging_time, m_lpy.Filter(startFactor * ay));
    m_raw_inp_z.AddPoint(m_logging_time, m_lpz.Filter(startFactor * az));

    m_logging_time += m_step_inp;
}